

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

void __thiscall CPU::ASL_AB_X(CPU *this)

{
  byte bVar1;
  byte bVar2;
  uint16_t uVar3;
  uint8_t data;
  uint8_t addr;
  CPU *this_local;
  
  this->cycles = 7;
  uVar3 = GetWord(this);
  bVar1 = (char)uVar3 + this->X;
  this->cycles = this->cycles - 1;
  bVar2 = ReadByte(this,(ushort)bVar1);
  (this->field_6).ps = (this->field_6).ps & 0xfe | ((bVar2 & 0x80) != 0 && -1 < (int)(bVar2 & 0x80))
  ;
  bVar2 = bVar2 << 1;
  this->cycles = this->cycles - 1;
  (this->field_6).ps = (this->field_6).ps & 0xfd | (bVar2 == 0) << 1;
  (this->field_6).ps =
       (this->field_6).ps & 0x7f | ((bVar2 & 0x80) != 0 && -1 < (int)(bVar2 & 0x80)) << 7;
  WriteByte(this,(ushort)bVar1,bVar2);
  return;
}

Assistant:

void CPU::ASL_AB_X()
{
    cycles = 7;
    uint8_t addr = GetWord() + X;
    cycles--;
    uint8_t data = ReadByte(addr);
    C = (data & 0b10000000) > 0;
    data <<= 1;
    cycles--;
    Z = (data == 0);
    N = (data & 0b10000000) > 0;
    WriteByte(addr, data);
}